

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O1

ListInfo __thiscall QTextMarkdownWriter::listInfo(QTextMarkdownWriter *this,QTextList *list)

{
  QDebug QVar1;
  bool bVar2;
  int iVar3;
  QTextList *pQVar4;
  QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *this_00;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString local_f0;
  QDebug local_d8;
  QDebug local_d0;
  QDebug local_c8;
  Stream *local_c0;
  QDebug local_b8;
  QTextList *local_b0;
  ListInfo local_a1;
  QString local_a0;
  undefined1 local_88 [20];
  undefined4 local_74;
  char *local_70;
  undefined1 local_68 [16];
  QTextDocumentPrivate *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_listInfo;
  local_b0 = list;
  bVar2 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::contains(this_00,&local_b0);
  if (bVar2) {
    local_88._0_4_ = local_88._0_4_ & 0xffffff00;
    local_a1 = QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::value
                         (this_00,&local_b0,(ListInfo *)local_88);
  }
  else {
    local_a1.loose = false;
    iVar3 = QTextList::count(local_b0);
    if (1 < iVar3) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::item((QTextList *)local_48,(int)local_b0);
      pQVar4 = local_b0;
      local_58 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextList::count(local_b0);
      QTextList::item((QTextList *)&local_58,(int)pQVar4);
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::next((QTextBlock *)local_68);
      bVar2 = QTextBlock::isValid((QTextBlock *)local_68);
      if (bVar2) {
        do {
          if ((QTextDocumentPrivate *)local_68._0_8_ == local_58) {
            if (local_68._8_4_ == (int)puStack_50) break;
          }
          lcMDW();
          if (((byte)lcMDW::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
            local_88._0_4_ = 2;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_8_ = 0;
            local_74 = 0;
            local_70 = lcMDW::category.name;
            QMessageLogger::debug();
            QVar1.stream = local_d8.stream;
            QVar6.m_data = (storage_type *)0x12;
            QVar6.m_size = (qsizetype)&local_a0;
            QString::fromUtf8(QVar6);
            QTextStream::operator<<(&(QVar1.stream)->ts,&local_a0);
            if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((local_d8.stream)->space == true) {
              QTextStream::operator<<(&(local_d8.stream)->ts,' ');
            }
            local_d0.stream = local_d8.stream;
            (local_d8.stream)->ref = (local_d8.stream)->ref + 1;
            ::operator<<((QDebug *)&local_c8,(QObject *)&local_d0);
            QTextBlock::text(&local_f0,(QTextBlock *)local_68);
            pcVar5 = local_f0.d.ptr;
            if (local_f0.d.ptr == (char16_t *)0x0) {
              pcVar5 = (char16_t *)&QString::_empty;
            }
            QDebug::putString((QChar *)&local_c8,(ulong)pcVar5);
            if ((local_c8.stream)->space == true) {
              QTextStream::operator<<(&(local_c8.stream)->ts,' ');
            }
            QVar1.stream = local_c8.stream;
            QVar7.m_data = (storage_type *)0xd;
            QVar7.m_size = (qsizetype)&local_a0;
            QString::fromUtf8(QVar7);
            QTextStream::operator<<(&(QVar1.stream)->ts,&local_a0);
            if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((local_c8.stream)->space == true) {
              QTextStream::operator<<(&(local_c8.stream)->ts,' ');
            }
            local_c0 = local_c8.stream;
            (local_c8.stream)->ref = (local_c8.stream)->ref + 1;
            QTextBlock::textList((QTextBlock *)local_68);
            ::operator<<((QDebug *)&local_b8,(QObject *)&local_c0);
            QDebug::~QDebug(&local_b8);
            QDebug::~QDebug((QDebug *)&local_c0);
            if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
              }
            }
            QDebug::~QDebug(&local_c8);
            QDebug::~QDebug(&local_d0);
            QDebug::~QDebug(&local_d8);
          }
          pQVar4 = QTextBlock::textList((QTextBlock *)local_68);
          if (pQVar4 == (QTextList *)0x0) {
            lcMDW();
            if (((byte)lcMDW::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
              local_88._0_4_ = 2;
              local_88._4_4_ = 0;
              local_88._8_4_ = 0;
              local_88._12_8_ = 0;
              local_74 = 0;
              local_70 = lcMDW::category.name;
              QMessageLogger::debug();
              QVar1.stream = local_c8.stream;
              QVar8.m_data = (storage_type *)0x1b;
              QVar8.m_size = (qsizetype)&local_a0;
              QString::fromUtf8(QVar8);
              QTextStream::operator<<(&(QVar1.stream)->ts,&local_a0);
              if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((local_c8.stream)->space == true) {
                QTextStream::operator<<(&(local_c8.stream)->ts,' ');
              }
              QTextBlock::text(&local_f0,(QTextBlock *)local_48);
              if (local_f0.d.ptr == (char16_t *)0x0) {
                local_f0.d.ptr = (char16_t *)&QString::_empty;
              }
              QDebug::putString((QChar *)&local_c8,(ulong)local_f0.d.ptr);
              if ((local_c8.stream)->space == true) {
                QTextStream::operator<<(&(local_c8.stream)->ts,' ');
              }
              QVar1.stream = local_c8.stream;
              QVar9.m_data = (storage_type *)0xe;
              QVar9.m_size = (qsizetype)&local_a0;
              QString::fromUtf8(QVar9);
              QTextStream::operator<<(&(QVar1.stream)->ts,&local_a0);
              if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((local_c8.stream)->space == true) {
                QTextStream::operator<<(&(local_c8.stream)->ts,' ');
              }
              QTextBlock::text(&local_a0,(QTextBlock *)local_68);
              if (local_a0.d.ptr == (char16_t *)0x0) {
                local_a0.d.ptr = (char16_t *)&QString::_empty;
              }
              QDebug::putString((QChar *)&local_c8,(ulong)local_a0.d.ptr);
              if ((local_c8.stream)->space == true) {
                QTextStream::operator<<(&(local_c8.stream)->ts,' ');
              }
              if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
                }
              }
              QDebug::~QDebug(&local_c8);
            }
            local_a1.loose = true;
            break;
          }
          QTextBlock::next((QTextBlock *)local_88);
          local_68._0_8_ = CONCAT44(local_88._4_4_,local_88._0_4_);
          local_68._8_4_ = local_88._8_4_;
          bVar2 = QTextBlock::isValid((QTextBlock *)local_68);
        } while (bVar2);
      }
    }
    QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::insert(this_00,&local_b0,&local_a1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (ListInfo)local_a1.loose;
}

Assistant:

QTextMarkdownWriter::ListInfo QTextMarkdownWriter::listInfo(QTextList *list)
{
    if (!m_listInfo.contains(list)) {
        // decide whether this list is loose or tight
        ListInfo info;
        info.loose = false;
        if (list->count() > 1) {
            QTextBlock first = list->item(0);
            QTextBlock last = list->item(list->count() - 1);
            QTextBlock next = first.next();
            while (next.isValid()) {
                if (next == last)
                    break;
                qCDebug(lcMDW) << "next block in list" << list << next.text() << "part of list?" << next.textList();
                if (!next.textList()) {
                    // If we find a continuation paragraph, this list is "loose"
                    // because it will need a blank line to separate that paragraph.
                    qCDebug(lcMDW) << "decided list beginning with" << first.text() << "is loose after" << next.text();
                    info.loose = true;
                    break;
                }
                next = next.next();
            }
        }
        m_listInfo.insert(list, info);
        return info;
    }
    return m_listInfo.value(list);
}